

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
date::detail::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_(date::detail::classify)4>
          *t)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  uchar uVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  save_stream<char,_std::char_traits<char>_> _;
  char local_31;
  save_stream<char,_std::char_traits<char>_> local_30;
  
  save_stream<char,_std::char_traits<char>_>::save_stream(&local_30,os);
  if ((t->super_time_of_day_base).neg_ == true) {
    local_31 = '-';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,&local_31,1);
  }
  lVar3 = *(long *)os;
  pbVar1 = os + *(long *)(lVar3 + -0x18);
  if (os[*(long *)(lVar3 + -0x18) + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x0) {
    std::ios::widen((char)pbVar1);
    pbVar1[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
    lVar3 = *(long *)os;
  }
  pbVar1[0xe0] = (basic_ostream<char,_std::char_traits<char>_>)0x30;
  *(undefined4 *)(os + *(long *)(lVar3 + -0x18) + 0x18) = 0x82;
  if (1 < (byte)((t->super_time_of_day_base).mode_ - 1)) {
    *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 0x10) = 2;
  }
  poVar4 = std::ostream::_M_insert<long>((long)os);
  local_31 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  poVar4 = std::ostream::_M_insert<long>((long)os);
  local_31 = ':';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&t->s_);
  uVar2 = (t->super_time_of_day_base).mode_;
  if (uVar2 == '\x01') {
    pcVar5 = "am";
  }
  else {
    if (uVar2 != '\x02') goto LAB_001081a6;
    pcVar5 = "pm";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar5,2);
LAB_001081a6:
  save_stream<char,_std::char_traits<char>_>::~save_stream(&local_30);
  return os;
}

Assistant:

std::basic_ostream<CharT, Traits>&
    operator<<(std::basic_ostream<CharT, Traits>& os, const time_of_day_storage& t)
    {
        using namespace std;
        detail::save_stream<CharT, Traits> _(os);
        if (t.neg_)
            os << '-';
        os.fill('0');
        os.flags(std::ios::dec | std::ios::right);
        if (t.mode_ != am && t.mode_ != pm)
            os.width(2);
        os << t.h_.count() << ':';
        os.width(2);
        os << t.m_.count() << ':' << t.s_;
        switch (t.mode_)
        {
        case am:
            os << "am";
            break;
        case pm:
            os << "pm";
            break;
        }
        return os;
    }